

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_pathops.cc
# Opt level: O2

string * ctemplate::Basename(string *__return_storage_ptr__,string *path)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  
  pcVar1 = (path->_M_dataplus)._M_p;
  lVar2 = -1;
  pcVar3 = pcVar1 + (path->_M_string_length - 1);
  do {
    pcVar5 = pcVar3;
    lVar4 = lVar2;
    if (pcVar5 < pcVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
      return __return_storage_ptr__;
    }
    lVar2 = lVar4 + 1;
    pcVar3 = pcVar5 + -1;
  } while (*pcVar5 != '/');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar5 + 1,pcVar5 + -1 + lVar4 + 3);
  return __return_storage_ptr__;
}

Assistant:

string Basename(const string& path) {
  for (const char* p = path.data() + path.size()-1; p >= path.data(); --p) {
    if (IsPathSep(*p))
      return string(p+1, path.data() + path.size() - (p+1));
  }
  return path;   // no path-separator found, so whole string is the basename
}